

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::access_chain_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t base,uint32_t *indices,
          uint32_t count,SPIRType *target_type,AccessChainMeta *meta,bool ptr_chain)

{
  bool bVar1;
  ID id;
  int iVar2;
  uint32_t uVar3;
  size_type sVar4;
  SPIRType *pSVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  AccessChainFlags AVar8;
  uint32_t *out_matrix_stride;
  uint32_t base_local;
  bool need_transpose;
  SPIRType *local_b8;
  uint32_t *local_b0;
  SPIRType *local_a8;
  CompilerGLSL *local_a0;
  uint32_t array_stride;
  uint32_t matrix_stride;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_58;
  
  ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)count;
  base_local = base;
  local_b8 = target_type;
  sVar4 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&(this->flattened_buffer_blocks)._M_h,&base_local);
  local_b0 = indices;
  if (sVar4 == 0) {
    sVar6 = ::std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&(this->flattened_structs)._M_h,&base_local);
    if ((count == 0) || (sVar6 == 0)) {
      if (ptr_chain) {
        id.id = Compiler::expression_type_id(&this->super_Compiler,base_local);
        AVar8 = 0xc;
        if (((this->backend).native_pointers == true) &&
           (bVar1 = Compiler::has_decoration(&this->super_Compiler,id,ArrayStride), bVar1)) {
          pSVar5 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id.id);
          local_a8 = Compiler::get_pointee_type(&this->super_Compiler,pSVar5);
          iVar2 = (*(this->super_Compiler)._vptr_Compiler[0x2e])(this);
          local_b8 = (SPIRType *)CONCAT44(local_b8._4_4_,iVar2);
          uVar3 = Compiler::get_decoration(&this->super_Compiler,id,ArrayStride);
          if ((uint32_t)local_b8 != uVar3) {
            bVar1 = Compiler::is_vector(&this->super_Compiler,local_a8);
            AVar8 = (uint)bVar1 << 8 | 0x8c;
          }
        }
      }
      else {
        AVar8 = 8;
      }
      access_chain_internal_abi_cxx11_
                (__return_storage_ptr__,this,base_local,local_b0,count,AVar8,meta);
    }
    else {
      AVar8 = (uint)ptr_chain * 4 + 10;
      pmVar7 = ::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->flattened_structs,&base_local);
      if ((*pmVar7 == true) && (AVar8 = AVar8 | 0x20, meta != (AccessChainMeta *)0x0)) {
        meta->flattened_struct = local_b8->basetype == Struct;
      }
      access_chain_internal_abi_cxx11_
                ((string *)&array_stride,this,base_local,local_b0,count,AVar8,(AccessChainMeta *)0x0
                );
      ::std::__cxx11::string::substr((ulong)&matrix_stride,(ulong)&array_stride);
      ::std::__cxx11::string::~string((string *)&array_stride);
      if (meta != (AccessChainMeta *)0x0) {
        meta->need_transpose = false;
        meta->storage_is_packed = false;
      }
      to_flattened_access_chain_expression_abi_cxx11_((string *)&array_stride,this,base_local);
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                (__return_storage_ptr__,(spirv_cross *)&array_stride,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x330c68,
                 (char (*) [2])&matrix_stride,ts_2);
      ParsedIR::sanitize_underscores(__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&array_stride);
      ::std::__cxx11::string::~string((string *)&matrix_stride);
    }
  }
  else {
    out_matrix_stride = &matrix_stride;
    matrix_stride = 0;
    array_stride = 0;
    need_transpose = false;
    local_a8 = (SPIRType *)__return_storage_ptr__;
    pSVar5 = Compiler::expression_type(&this->super_Compiler,base_local);
    local_a0 = this;
    flattened_access_chain_offset_abi_cxx11_
              (&local_58,this,pSVar5,indices,count,0,0x10,&need_transpose,out_matrix_stride,
               &array_stride,ptr_chain);
    uVar3 = (uint32_t)out_matrix_stride;
    ::std::__cxx11::string::~string((string *)&local_58);
    __return_storage_ptr__ = (string *)local_a8;
    if (meta != (AccessChainMeta *)0x0) {
      bVar1 = false;
      if (1 < local_b8->columns) {
        bVar1 = need_transpose;
      }
      meta->need_transpose = bVar1;
      meta->storage_is_packed = false;
    }
    flattened_access_chain_abi_cxx11_
              ((string *)local_a8,local_a0,base_local,local_b0,count,local_b8,0,matrix_stride,uVar3,
               (bool)(need_transpose & 1));
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::access_chain(uint32_t base, const uint32_t *indices, uint32_t count, const SPIRType &target_type,
                                  AccessChainMeta *meta, bool ptr_chain)
{
	if (flattened_buffer_blocks.count(base))
	{
		uint32_t matrix_stride = 0;
		uint32_t array_stride = 0;
		bool need_transpose = false;
		flattened_access_chain_offset(expression_type(base), indices, count, 0, 16, &need_transpose, &matrix_stride,
		                              &array_stride, ptr_chain);

		if (meta)
		{
			meta->need_transpose = target_type.columns > 1 && need_transpose;
			meta->storage_is_packed = false;
		}

		return flattened_access_chain(base, indices, count, target_type, 0, matrix_stride, array_stride,
		                              need_transpose);
	}
	else if (flattened_structs.count(base) && count > 0)
	{
		AccessChainFlags flags = ACCESS_CHAIN_CHAIN_ONLY_BIT | ACCESS_CHAIN_SKIP_REGISTER_EXPRESSION_READ_BIT;
		if (ptr_chain)
			flags |= ACCESS_CHAIN_PTR_CHAIN_BIT;

		if (flattened_structs[base])
		{
			flags |= ACCESS_CHAIN_FLATTEN_ALL_MEMBERS_BIT;
			if (meta)
				meta->flattened_struct = target_type.basetype == SPIRType::Struct;
		}

		auto chain = access_chain_internal(base, indices, count, flags, nullptr).substr(1);
		if (meta)
		{
			meta->need_transpose = false;
			meta->storage_is_packed = false;
		}

		auto basename = to_flattened_access_chain_expression(base);
		auto ret = join(basename, "_", chain);
		ParsedIR::sanitize_underscores(ret);
		return ret;
	}
	else
	{
		AccessChainFlags flags = ACCESS_CHAIN_SKIP_REGISTER_EXPRESSION_READ_BIT;
		if (ptr_chain)
		{
			flags |= ACCESS_CHAIN_PTR_CHAIN_BIT;
			// PtrAccessChain could get complicated.
			TypeID type_id = expression_type_id(base);
			if (backend.native_pointers && has_decoration(type_id, DecorationArrayStride))
			{
				// If there is a mismatch we have to go via 64-bit pointer arithmetic :'(
				// Using packed hacks only gets us so far, and is not designed to deal with pointer to
				// random values. It works for structs though.
				auto &pointee_type = get_pointee_type(get<SPIRType>(type_id));
				uint32_t physical_stride = get_physical_type_stride(pointee_type);
				uint32_t requested_stride = get_decoration(type_id, DecorationArrayStride);
				if (physical_stride != requested_stride)
				{
					flags |= ACCESS_CHAIN_PTR_CHAIN_POINTER_ARITH_BIT;
					if (is_vector(pointee_type))
						flags |= ACCESS_CHAIN_PTR_CHAIN_CAST_TO_SCALAR_BIT;
				}
			}
		}

		return access_chain_internal(base, indices, count, flags, meta);
	}
}